

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O3

HighsStatus __thiscall
HighsSparseMatrix::assessStart(HighsSparseMatrix *this,HighsLogOptions *log_options)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  uint uVar4;
  HighsStatus HVar5;
  long lVar6;
  char *format;
  bool bVar7;
  
  piVar3 = (this->start_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*piVar3 == 0) {
    uVar1 = (&this->num_col_)[this->format_ != kColwise];
    bVar7 = false;
    if (1 < (int)uVar1) {
      bVar7 = true;
      lVar6 = 0;
      uVar4 = 0;
      do {
        uVar2 = piVar3[lVar6 + 1];
        if ((int)uVar2 < (int)uVar4) {
          format = "Matrix start[%d] = %d > %d = start[%d]\n";
LAB_0037b786:
          highsLogUser(log_options,kError,format,(ulong)((int)lVar6 + 1),(ulong)uVar2,(ulong)uVar4);
          break;
        }
        if (piVar3[(int)uVar1] < (int)uVar2) {
          format = "Matrix start[%d] = %d > %d = number of nonzeros\n";
          uVar4 = piVar3[(int)uVar1];
          goto LAB_0037b786;
        }
        bVar7 = lVar6 + 2 < (long)(int)uVar1;
        lVar6 = lVar6 + 1;
        uVar4 = uVar2;
      } while ((ulong)uVar1 - 1 != lVar6);
    }
    HVar5 = -(uint)bVar7;
  }
  else {
    highsLogUser(log_options,kError,"Matrix start[0] = %d, not 0\n");
    HVar5 = kError;
  }
  return HVar5;
}

Assistant:

bool HighsSparseMatrix::isColwise() const {
  return this->format_ == MatrixFormat::kColwise;
}